

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O0

int8_t msocket_unix_listen(msocket_t *self,char *socket_path)

{
  int *piVar1;
  undefined4 local_9c;
  socklen_t sockoptlen;
  int sockoptval;
  int sockunix;
  int rc;
  uint8_t mode;
  sockaddr_un saddr;
  char *socket_path_local;
  msocket_t *self_local;
  
  saddr.sun_path._100_8_ = socket_path;
  if (self == (msocket_t *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    return -1;
  }
  sockunix._1_1_ = 2;
  memset((void *)((long)&sockunix + 2),0,0x6e);
  sockunix._2_2_ = 1;
  if (*(char *)saddr.sun_path._100_8_ == '\0') {
    rc._0_1_ = 0;
    strncpy((char *)((long)&rc + 1),(char *)(saddr.sun_path._100_8_ + 1),0x6a);
  }
  else {
    strncpy((char *)&rc,(char *)saddr.sun_path._100_8_,0x6b);
  }
  if (sockunix._1_1_ == 2) {
    sockoptlen = socket(1,1,0);
    if ((int)sockoptlen < 0) {
      return -1;
    }
    local_9c = 1;
    setsockopt(sockoptlen,1,2,&local_9c,4);
    sockoptval = bind(sockoptlen,(sockaddr *)((long)&sockunix + 2),0x6e);
    if (sockoptval < 0) {
      close(sockoptlen);
      return (int8_t)sockoptval;
    }
    sockoptval = listen(sockoptlen,5);
    if (sockoptval < 0) {
      close(sockoptlen);
      return (int8_t)sockoptval;
    }
    self->tcpsockfd = sockoptlen;
    self->state = '\x01';
    self->socketMode = self->socketMode | sockunix._1_1_;
  }
  return '\0';
}

Assistant:

int8_t msocket_unix_listen(msocket_t *self, const char *socket_path)
{
   if(self != 0){

      struct sockaddr_un saddr;
      uint8_t mode = MSOCKET_MODE_TCP; //internally we can act the same way as if this is a TCP socket

      memset(&saddr, 0,sizeof(saddr));
      saddr.sun_family = AF_UNIX;
      if (*socket_path == '\0') {
         *saddr.sun_path = '\0';
         strncpy(saddr.sun_path+1, socket_path+1, sizeof(saddr.sun_path)-2);
      } else {
         strncpy(saddr.sun_path, socket_path, sizeof(saddr.sun_path)-1);
      }
      if (mode == MSOCKET_MODE_TCP){
         int rc;
         SOCKET_T sockunix;
         int sockoptval;
         socklen_t sockoptlen = sizeof(sockoptval);
         sockunix = socket(PF_LOCAL, SOCK_STREAM, 0);
         if(IS_INVALID_SOCKET(sockunix)){
            return -1;
         }
         sockoptval = 1;
         setsockopt(sockunix, SOL_SOCKET, SO_REUSEADDR, (const char*)&sockoptval, sockoptlen);
         rc=bind(sockunix, (struct sockaddr *) &saddr,sizeof(saddr));
         if (rc < 0){
            SOCKET_CLOSE(sockunix);
            return rc;
         }
         rc = listen(sockunix,5);
         if(rc<0){
            SOCKET_CLOSE(sockunix);
            return rc;
         }
         self->tcpsockfd = sockunix;
         self->state = MSOCKET_STATE_LISTENING;
         self->socketMode |= mode;
      }
      return 0;
   }
   errno = EINVAL;
   return -1;
}